

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [10],char **Args_1,
          char (*Args_2) [4],char (*Args_3) [18],uint *Args_4,char (*Args_5) [3],uint *Args_6)

{
  stringstream local_1c0 [8];
  stringstream ss;
  uint *Args_local_4;
  char (*Args_local_3) [18];
  char (*Args_local_2) [4];
  char **Args_local_1;
  char (*Args_local) [10];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [10])this,(char **)Args,(char (*) [4])Args_1,(char (*) [18])Args_2,
             (uint *)Args_3,(char (*) [3])Args_4,(uint *)Args_5);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}